

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KktCheck.cpp
# Opt level: O1

void __thiscall KktCheck::checkKKT(KktCheck *this)

{
  char *pcVar1;
  ofstream myfile;
  long local_210;
  filebuf local_208 [240];
  ios_base local_118 [264];
  
  if (this->numCol != 0) {
    this->istrueGlb = false;
    makeARCopy(this);
    chPrimalBounds(this);
    chPrimalFeas(this);
    chDualFeas(this);
    chComplementarySlackness(this);
    chStOfLagrangian(this);
    if (this->print == 2) {
      std::ofstream::ofstream(&local_210);
      std::ofstream::open((char *)&local_210,0x15abc7);
      pcVar1 = "           KKT pass      ";
      if (this->istrueGlb != false) {
        pcVar1 = "           KKT fail      ";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_210,pcVar1,0x19);
      std::ofstream::close();
      local_210 = _VTT;
      *(undefined8 *)(local_208 + *(long *)(_VTT + -0x18) + -8) = _sqrt;
      std::filebuf::~filebuf(local_208);
      std::ios_base::~ios_base(local_118);
    }
  }
  return;
}

Assistant:

void KktCheck::checkKKT() {
	if (numCol == 0)
		return;
	
	istrueGlb = false;
	

	makeARCopy();
	//printAR();printSol();
	chPrimalBounds() ;
	chPrimalFeas();
	chDualFeas();
	chComplementarySlackness();
	chStOfLagrangian();
	
	if (print == 2) {
		ofstream myfile;
  		myfile.open ("../experiments/out", ios::app ); 
		if (istrueGlb)	
			myfile << "           KKT fail      ";
		else
			myfile << "           KKT pass      ";
  		myfile.close();
	}
		
}